

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoCaps.cpp
# Opt level: O0

double __thiscall TwoCaps::coordinateY(TwoCaps *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int G_local;
  int L_local;
  int K_local;
  int J_local;
  TwoCaps *this_local;
  
  if (G == 0) {
    this->theta1 = (double)J * this->d_theta1 + this->theta1_lb;
    this->theta2 = (double)K * this->d_theta2 + this->theta2_lb;
    dVar3 = (this->super_Parameterization).radius;
    dVar2 = sin(this->theta2);
    dVar1 = cos(this->theta1);
    (this->super_Parameterization).y = dVar3 * dVar2 * dVar1;
  }
  else if (G == 1) {
    this->theta1 = (double)J * this->d_theta1_cap + this->theta1_cap_lb;
    this->theta2 = (double)K * this->d_theta2_cap + this->theta2_cap_lb;
    dVar3 = (this->super_Parameterization).radius;
    dVar2 = cos(this->theta2);
    (this->super_Parameterization).y = -dVar3 * dVar2;
    (this->super_Parameterization).x =
         (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
    (this->super_Parameterization).y =
         (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    (this->super_Parameterization).z = (this->super_Parameterization).z_ub;
    dVar3 = sqrt((this->super_Parameterization).z * (this->super_Parameterization).z +
                 (this->super_Parameterization).x * (this->super_Parameterization).x +
                 (this->super_Parameterization).y * (this->super_Parameterization).y);
    this->rad_B = dVar3;
    this->proj = (this->super_Parameterization).radius / this->rad_B;
    (this->super_Parameterization).y = this->proj * (this->super_Parameterization).y;
  }
  else if (G == 2) {
    this->theta1 = (double)J * this->d_theta1_cap + this->theta1_cap_lb;
    this->theta2 = (double)K * this->d_theta2_cap + this->theta2_cap_lb;
    dVar3 = (this->super_Parameterization).radius;
    dVar2 = cos(this->theta2);
    (this->super_Parameterization).y = dVar3 * dVar2;
    (this->super_Parameterization).x =
         -(double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_ub;
    (this->super_Parameterization).y =
         (double)K * (this->super_Parameterization).dy + (this->super_Parameterization).y_lb;
    (this->super_Parameterization).z = (this->super_Parameterization).z_lb;
    dVar3 = sqrt((this->super_Parameterization).z * (this->super_Parameterization).z +
                 (this->super_Parameterization).x * (this->super_Parameterization).x +
                 (this->super_Parameterization).y * (this->super_Parameterization).y);
    this->rad_B = dVar3;
    this->proj = (this->super_Parameterization).radius / this->rad_B;
    (this->super_Parameterization).y = this->proj * (this->super_Parameterization).y;
  }
  return (this->super_Parameterization).y;
}

Assistant:

double TwoCaps::coordinateY(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Low latitude spherical shell
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      y = radius * sin(theta2) * cos(theta1);
      break;
    case 1:  // Top cap
      theta1 = theta1_cap_lb + (double)J * d_theta1_cap;
      theta2 = theta2_cap_lb + (double)K * d_theta2_cap;
      y = -radius * cos(theta2);

      x = x_lb + (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_ub;

      rad_B = sqrt(x * x + y * y + z * z);
      proj = radius / rad_B;
      y *= proj;
      break;
    case 2:  // Bottom cap
      theta1 = theta1_cap_lb + (double)J * d_theta1_cap;
      theta2 = theta2_cap_lb + (double)K * d_theta2_cap;
      y =  radius * cos(theta2);

      x = x_ub - (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_lb;

      rad_B = sqrt(x * x + y * y + z * z);
      proj = radius / rad_B;
      y *= proj;
      break;
  }

  return y;
}